

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O0

ssize_t __thiscall
event_track::EventMessageInstanceBox::write
          (EventMessageInstanceBox *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  int iVar2;
  uint32_t in;
  int iVar3;
  size_t sVar4;
  size_type sVar5;
  reference pvVar6;
  long lVar7;
  undefined4 in_register_00000034;
  uint32_t sz_1;
  char c;
  int k;
  uint32_t sz;
  uint32_t bytes_written;
  char long_buf [8];
  char int_buf [4];
  ostream *ostr_local;
  EventMessageInstanceBox *this_local;
  
  register0x00000030 = (char *)CONCAT44(in_register_00000034,__fd);
  iVar2 = std::__cxx11::string::compare((char *)&this->scheme_id_uri_);
  if (iVar2 == 0) {
    sVar4 = size(this);
    anon_unknown.dwarf_19776::fmp4_write_uint32((uint32_t)sVar4,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
    in = (int)sVar5 + 8;
    anon_unknown.dwarf_19776::fmp4_write_uint32(in,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
    if (sVar5 != 0) {
      for (sz_1 = 0;
          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (&this->message_data_), (ulong)(long)(int)sz_1 < sVar5; sz_1 = sz_1 + 1)
      {
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->message_data_,(long)(int)sz_1);
        if (*pvVar6 == ' ') {
          std::ostream::put((char)stack0xffffffffffffffe8);
        }
        else {
          std::ostream::put((char)stack0xffffffffffffffe8);
        }
      }
    }
    anon_unknown.dwarf_19776::fmp4_write_uint32(in,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    k = 0x10;
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
    pcVar1 = stack0xffffffffffffffe8;
    if (sVar5 != 0) {
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->message_data_,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
      std::ostream::write(pcVar1,(long)pvVar6);
    }
  }
  else {
    sVar4 = size(this);
    anon_unknown.dwarf_19776::fmp4_write_uint32((uint32_t)sVar4,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    std::ostream::put((char)stack0xffffffffffffffe8);
    anon_unknown.dwarf_19776::fmp4_write_uint32(0,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    anon_unknown.dwarf_19776::fmp4_write_int64(this->presentation_time_delta_,(char *)&sz);
    std::ostream::write(stack0xffffffffffffffe8,(long)&sz);
    anon_unknown.dwarf_19776::fmp4_write_uint32(this->event_duration_,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    anon_unknown.dwarf_19776::fmp4_write_uint32(this->id_,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    pcVar1 = stack0xffffffffffffffe8;
    lVar7 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write(pcVar1,lVar7);
    iVar2 = std::__cxx11::string::size();
    pcVar1 = stack0xffffffffffffffe8;
    lVar7 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write(pcVar1,lVar7);
    iVar3 = std::__cxx11::string::size();
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
    pcVar1 = stack0xffffffffffffffe8;
    if (sVar5 != 0) {
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->message_data_,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
      std::ostream::write(pcVar1,(long)pvVar6);
    }
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
    k = (int)sVar5 + iVar3 + iVar2 + 0x22;
  }
  return (ulong)(uint)k;
}

Assistant:

size_t write(std::ostream &ostr)
		{
			char int_buf[4];
			char long_buf[8];
			uint32_t bytes_written = 0;

			// write as webvtt
			if (scheme_id_uri_.compare("urn:webvtt") == 0) 
			{
				uint32_t sz = (uint32_t)this->size();
				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;

				ostr.put('v');
				ostr.put('t');
				ostr.put('t');
				ostr.put('c');
				bytes_written += 4;

				sz = message_data_.size() + 8;
				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;
				ostr.put('i');
				ostr.put('d');
				ostr.put('e');
				ostr.put('n');

				if (message_data_.size())
				{
					for (int k = 0; k < message_data_.size(); k++)
                    {
					   char c = (char) message_data_[k];
					   if (c != ' ')
					      ostr.put(c);
					   else 
						  ostr.put('-');

					}					
				}
					

				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;

				ostr.put('p');
				ostr.put('a');
				ostr.put('y');
				ostr.put('l');

				if (message_data_.size())
					ostr.write((char*)&message_data_[0], message_data_.size());

			}
			else {
				uint32_t sz = (uint32_t)this->size();
				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;

				ostr.put('e');
				ostr.put('m');
				ostr.put('i');
				ostr.put('b');
				bytes_written += 4;
				ostr.put((uint8_t)0);
				ostr.put(0u);
				ostr.put(0u);
				ostr.put(0u);
				bytes_written += 4;

				fmp4_write_uint32(0, int_buf);
				ostr.write(int_buf, 4);
				bytes_written += 4;
				fmp4_write_int64(presentation_time_delta_, long_buf);
				ostr.write(long_buf, 8);
				bytes_written += 8;
				fmp4_write_uint32(event_duration_, int_buf);
				ostr.write(int_buf, 4);
				bytes_written += 4;
				fmp4_write_uint32(id_, int_buf);
				ostr.write(int_buf, 4);
				bytes_written += 4;
				ostr.write(scheme_id_uri_.c_str(), scheme_id_uri_.size() + 1);
				bytes_written += (uint32_t)scheme_id_uri_.size() + 1;
				ostr.write(value_.c_str(), value_.size() + 1);
				bytes_written += (uint32_t)value_.size() + 1;

				if (message_data_.size())
					ostr.write((char*)&message_data_[0], message_data_.size());

				bytes_written += (uint32_t)message_data_.size();
			}
			return bytes_written;
		}